

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::composeUTF8
          (Normalizer2Impl *this,uint32_t options,UBool onlyContiguous,uint8_t *src,uint8_t *limit,
          ByteSink *sink,Edits *edits,UErrorCode *errorCode)

{
  ushort norm16_00;
  ushort norm16_01;
  byte bVar1;
  UBool UVar2;
  byte bVar3;
  UChar32 UVar4;
  int iVar5;
  uint uVar6;
  int32_t iVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  uint16_t *puVar10;
  uint8_t *puVar11;
  UChar *s16_00;
  byte *pbVar12;
  uint local_1ac;
  uint local_154;
  undefined1 local_140 [8];
  ReorderingBuffer buffer;
  uint8_t *puStack_f8;
  int32_t __index;
  uint8_t *p;
  uint local_e8;
  uint8_t __t3_1;
  uint8_t __t2_1;
  uint8_t __t1_1;
  int32_t __lead_1;
  uint8_t prevCC;
  uint16_t n16;
  uint8_t *nextSrc;
  uint8_t cc;
  UChar32 syllable_1;
  UChar32 syllable;
  int32_t t;
  UChar32 l;
  UChar32 prev;
  int32_t length;
  uint16_t *mapping;
  uint8_t __t3;
  uint8_t __t2;
  int iStack_a8;
  uint8_t __t1;
  int32_t __lead;
  int iStack_a0;
  uint16_t norm16;
  uint8_t *prevSrc;
  uint8_t *prevBoundary;
  undefined1 local_78 [7];
  uint8_t minNoMaybeLead;
  UnicodeString s16;
  ByteSink *sink_local;
  uint8_t *limit_local;
  uint8_t *src_local;
  UBool onlyContiguous_local;
  uint32_t options_local;
  Normalizer2Impl *this_local;
  
  s16.fUnion._48_8_ = sink;
  UnicodeString::UnicodeString((UnicodeString *)local_78);
  bVar1 = anon_unknown_15::leadByteForCP((uint)(ushort)this->minCompNoMaybeCP);
  limit_local = src;
  prevSrc = src;
LAB_001a1f54:
  do {
    while( true ) {
      puVar11 = limit_local;
      if (limit_local == limit) {
        if ((prevSrc != limit) && (s16.fUnion._48_8_ != 0)) {
          ByteSinkUtil::appendUnchanged
                    (prevSrc,limit,(ByteSink *)s16.fUnion._48_8_,options,edits,errorCode);
        }
        this_local._7_1_ = '\x01';
        goto LAB_001a32bc;
      }
      if (bVar1 <= *limit_local) break;
      limit_local = limit_local + 1;
    }
    _iStack_a0 = limit_local;
    pbVar12 = limit_local + 1;
    mapping._4_4_ = (uint)*limit_local;
    if ((*limit_local & 0x80) != 0) {
      pbVar8 = pbVar12;
      if (pbVar12 != limit) {
        if (mapping._4_4_ < 0xe0) {
          if ((0xc1 < mapping._4_4_) && ((byte)(*pbVar12 + 0x80) < 0x40)) {
            mapping._4_4_ =
                 (uint)this->normTrie->index[(int)(mapping._4_4_ & 0x1f)] +
                 (uint)(byte)(*pbVar12 + 0x80);
            limit_local = pbVar12;
LAB_001a22b2:
            pbVar12 = limit_local + 1;
            goto LAB_001a22d9;
          }
        }
        else if (mapping._4_4_ < 0xf0) {
          if (((((int)" 000000000000\x1000"[(int)(mapping._4_4_ & 0xf)] &
                1 << (sbyte)((int)(uint)*pbVar12 >> 5)) != 0) &&
              (pbVar8 = limit_local + 2, pbVar8 != limit)) && ((byte)(*pbVar8 + 0x80) < 0x40)) {
            mapping._4_4_ =
                 (uint)this->normTrie->index
                       [(int)((mapping._4_4_ & 0xf) * 0x40 + (*pbVar12 & 0x3f))] +
                 (uint)(byte)(*pbVar8 + 0x80);
            limit_local = pbVar8;
            goto LAB_001a22b2;
          }
        }
        else {
          iVar5 = mapping._4_4_ - 0xf0;
          if ((iVar5 < 5) && (((int)""[(int)(uint)*pbVar12 >> 4] & 1 << ((byte)iVar5 & 0x1f)) != 0))
          {
            uVar6 = iVar5 * 0x40 | *pbVar12 & 0x3f;
            puVar9 = limit_local + 2;
            pbVar8 = puVar9;
            if ((puVar9 != limit) &&
               ((((byte)(*puVar9 + 0x80) < 0x40 && (pbVar8 = limit_local + 3, pbVar8 != limit)) &&
                ((byte)(*pbVar8 + 0x80) < 0x40)))) {
              if ((int)uVar6 < (int)(uint)this->normTrie->shifted12HighStart) {
                local_154 = ucptrie_internalSmallU8Index_63
                                      (this->normTrie,uVar6,*puVar9 + 0x80,*pbVar8 + 0x80);
              }
              else {
                local_154 = this->normTrie->dataLength - 2;
              }
              mapping._4_4_ = local_154;
              limit_local = pbVar8;
              goto LAB_001a22b2;
            }
          }
        }
      }
      limit_local = pbVar8;
      mapping._4_4_ = this->normTrie->dataLength - 1;
      pbVar12 = limit_local;
    }
LAB_001a22d9:
    limit_local = pbVar12;
    norm16_00 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)mapping._4_4_ * 2);
    UVar2 = isCompYesAndZeroCC(this,norm16_00);
  } while (UVar2 != '\0');
  UVar2 = isMaybeOrNonZeroCC(this,norm16_00);
  if (UVar2 == '\0') {
    if (s16.fUnion._48_8_ == 0) {
      this_local._7_1_ = '\0';
      goto LAB_001a32bc;
    }
    UVar2 = isDecompNoAlgorithmic(this,norm16_00);
    if (UVar2 != '\0') {
      UVar2 = norm16HasCompBoundaryAfter(this,norm16_00,onlyContiguous);
      if ((UVar2 == '\0') && (UVar2 = hasCompBoundaryBefore(this,limit_local,limit), UVar2 == '\0'))
      goto LAB_001a2ebe;
      if ((prevSrc != puVar11) &&
         (UVar2 = ByteSinkUtil::appendUnchanged
                            (prevSrc,puVar11,(ByteSink *)s16.fUnion._48_8_,options,edits,errorCode),
         UVar2 == '\0')) goto LAB_001a32ae;
      UVar4 = getAlgorithmicDelta(this,norm16_00);
      anon_unknown_15::appendCodePointDelta
                (puVar11,limit_local,UVar4,(ByteSink *)s16.fUnion._48_8_,edits);
      prevSrc = limit_local;
      goto LAB_001a1f54;
    }
    if (norm16_00 < this->minNoNoCompBoundaryBefore) {
      UVar2 = norm16HasCompBoundaryAfter(this,norm16_00,onlyContiguous);
      if ((UVar2 != '\0') || (UVar2 = hasCompBoundaryBefore(this,limit_local,limit), UVar2 != '\0'))
      {
        if ((prevSrc != puVar11) &&
           (UVar2 = ByteSinkUtil::appendUnchanged
                              (prevSrc,puVar11,(ByteSink *)s16.fUnion._48_8_,options,edits,errorCode
                              ), UVar2 == '\0')) goto LAB_001a32ae;
        puVar10 = getMapping(this,norm16_00);
        UVar2 = ByteSinkUtil::appendChange
                          (puVar11,limit_local,(char16_t *)(puVar10 + 1),*puVar10 & 0x1f,
                           (ByteSink *)s16.fUnion._48_8_,edits,errorCode);
        if (UVar2 == '\0') goto LAB_001a32ae;
        prevSrc = limit_local;
        goto LAB_001a1f54;
      }
    }
    else if ((this->minNoNoEmpty <= norm16_00) &&
            ((UVar2 = hasCompBoundaryBefore(this,limit_local,limit), UVar2 != '\0' ||
             (UVar2 = hasCompBoundaryAfter(this,prevSrc,puVar11,onlyContiguous), UVar2 != '\0')))) {
      if ((prevSrc != puVar11) &&
         (UVar2 = ByteSinkUtil::appendUnchanged
                            (prevSrc,puVar11,(ByteSink *)s16.fUnion._48_8_,options,edits,errorCode),
         UVar2 == '\0')) goto LAB_001a32ae;
      if (edits != (Edits *)0x0) {
        iStack_a0 = (int)puVar11;
        Edits::addReplace(edits,(int)limit_local - iStack_a0,0);
      }
      prevSrc = limit_local;
      goto LAB_001a1f54;
    }
  }
  else {
    UVar2 = isJamoVT(norm16_00);
    if (UVar2 == '\0') {
      if (0xfe00 < norm16_00) {
        nextSrc._7_1_ = getCCFromNormalYesOrMaybe(norm16_00);
        if ((onlyContiguous == '\0') ||
           (bVar3 = getPreviousTrailCC(this,prevSrc,puVar11), bVar3 <= nextSrc._7_1_)) {
          do {
            if (limit_local == limit) {
              if (s16.fUnion._48_8_ != 0) {
                ByteSinkUtil::appendUnchanged
                          (prevSrc,limit,(ByteSink *)s16.fUnion._48_8_,options,edits,errorCode);
              }
              this_local._7_1_ = '\x01';
              goto LAB_001a32bc;
            }
            ___lead_1 = limit_local + 1;
            local_e8 = (uint)*limit_local;
            if ((*limit_local & 0x80) != 0) {
              if (___lead_1 != limit) {
                if (local_e8 < 0xe0) {
                  if ((0xc1 < local_e8) && ((byte)(*___lead_1 + 0x80) < 0x40)) {
                    local_e8 = (uint)this->normTrie->index[(int)(local_e8 & 0x1f)] +
                               (uint)(byte)(*___lead_1 + 0x80);
LAB_001a2d9e:
                    ___lead_1 = ___lead_1 + 1;
                    goto LAB_001a2dcb;
                  }
                }
                else if (local_e8 < 0xf0) {
                  bVar3 = *___lead_1;
                  if (((((int)" 000000000000\x1000"[(int)(local_e8 & 0xf)] &
                        1 << (sbyte)((int)(uint)bVar3 >> 5)) != 0) &&
                      (___lead_1 = limit_local + 2, ___lead_1 != limit)) &&
                     ((byte)(*___lead_1 + 0x80) < 0x40)) {
                    local_e8 = (uint)this->normTrie->index
                                     [(int)((local_e8 & 0xf) * 0x40 + (bVar3 & 0x3f))] +
                               (uint)(byte)(*___lead_1 + 0x80);
                    goto LAB_001a2d9e;
                  }
                }
                else {
                  iVar5 = local_e8 - 0xf0;
                  if ((iVar5 < 5) &&
                     (((int)""[(int)(uint)*___lead_1 >> 4] & 1 << ((byte)iVar5 & 0x1f)) != 0)) {
                    uVar6 = iVar5 * 0x40 | *___lead_1 & 0x3f;
                    ___lead_1 = limit_local + 2;
                    if ((___lead_1 != limit) &&
                       (((bVar3 = *___lead_1, (byte)(bVar3 + 0x80) < 0x40 &&
                         (___lead_1 = limit_local + 3, ___lead_1 != limit)) &&
                        ((byte)(*___lead_1 + 0x80) < 0x40)))) {
                      if ((int)uVar6 < (int)(uint)this->normTrie->shifted12HighStart) {
                        local_1ac = ucptrie_internalSmallU8Index_63
                                              (this->normTrie,uVar6,bVar3 + 0x80,*___lead_1 + 0x80);
                      }
                      else {
                        local_1ac = this->normTrie->dataLength - 2;
                      }
                      local_e8 = local_1ac;
                      goto LAB_001a2d9e;
                    }
                  }
                }
              }
              local_e8 = this->normTrie->dataLength - 1;
            }
LAB_001a2dcb:
            norm16_01 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)local_e8 * 2);
            if (norm16_01 < 0xfe02) goto LAB_001a2e5c;
            bVar3 = getCCFromNormalYesOrMaybe(norm16_01);
            if (bVar3 < nextSrc._7_1_) goto code_r0x001a2e2c;
            limit_local = ___lead_1;
            nextSrc._7_1_ = bVar3;
          } while( true );
        }
        if (s16.fUnion._48_8_ == 0) {
          this_local._7_1_ = '\0';
          goto LAB_001a32bc;
        }
      }
    }
    else {
      UVar4 = anon_unknown_15::previousHangulOrJamo(prevSrc,puVar11);
      if (puVar11[1] == 0x85) {
        if (UVar4 - 0x1100U < 0x13) {
          if (s16.fUnion._48_8_ == 0) {
            this_local._7_1_ = '\0';
            goto LAB_001a32bc;
          }
          syllable_1 = anon_unknown_15::getJamoTMinusBase(limit_local,limit);
          if (syllable_1 < 0) {
            UVar2 = hasCompBoundaryBefore(this,limit_local,limit);
            if (UVar2 != '\0') {
              syllable_1 = 0;
            }
          }
          else {
            limit_local = limit_local + 3;
          }
          if (-1 < syllable_1) {
            bVar3 = puVar11[2];
            puVar11 = puVar11 + -3;
            if ((prevSrc != puVar11) &&
               (UVar2 = ByteSinkUtil::appendUnchanged
                                  (prevSrc,puVar11,(ByteSink *)s16.fUnion._48_8_,options,edits,
                                   errorCode), UVar2 == '\0')) goto LAB_001a32ae;
            ByteSinkUtil::appendCodePoint
                      (puVar11,limit_local,
                       ((UVar4 - 0x1100U) * 0x15 + (bVar3 - 0xa1)) * 0x1c + 0xac00 + syllable_1,
                       (ByteSink *)s16.fUnion._48_8_,edits);
            prevSrc = limit_local;
            goto LAB_001a1f54;
          }
        }
      }
      else {
        UVar2 = Hangul::isHangulLV(UVar4);
        if (UVar2 != '\0') {
          if (s16.fUnion._48_8_ == 0) {
            this_local._7_1_ = '\0';
            goto LAB_001a32bc;
          }
          iVar7 = anon_unknown_15::getJamoTMinusBase(puVar11,limit_local);
          puVar11 = puVar11 + -3;
          if ((prevSrc != puVar11) &&
             (UVar2 = ByteSinkUtil::appendUnchanged
                                (prevSrc,puVar11,(ByteSink *)s16.fUnion._48_8_,options,edits,
                                 errorCode), UVar2 == '\0')) goto LAB_001a32ae;
          ByteSinkUtil::appendCodePoint
                    (puVar11,limit_local,UVar4 + iVar7,(ByteSink *)s16.fUnion._48_8_,edits);
          prevSrc = limit_local;
          goto LAB_001a1f54;
        }
      }
    }
  }
LAB_001a2ebe:
  if ((prevSrc != puVar11) && (UVar2 = norm16HasCompBoundaryBefore(this,norm16_00), UVar2 == '\0'))
  {
    puStack_f8 = puVar11 + -1;
    buffer.codePointLimit._4_4_ = (uint)puVar11[-1];
    if ((puVar11[-1] & 0x80) != 0) {
      uVar6 = ucptrie_internalU8PrevIndex_63
                        (this->normTrie,buffer.codePointLimit._4_4_,prevSrc,puStack_f8);
      puStack_f8 = puStack_f8 + -(long)(int)(uVar6 & 7);
      buffer.codePointLimit._4_4_ = (int)uVar6 >> 3;
    }
    UVar2 = norm16HasCompBoundaryAfter
                      (this,*(uint16_t *)
                             ((long)(this->normTrie->data).ptr0 +
                             (long)(int)buffer.codePointLimit._4_4_ * 2),onlyContiguous);
    if (UVar2 == '\0') {
      _iStack_a0 = puStack_f8;
    }
  }
  ReorderingBuffer::ReorderingBuffer
            ((ReorderingBuffer *)local_140,this,(UnicodeString *)local_78,errorCode);
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    decomposeShort(this,_iStack_a0,limit_local,'\0',onlyContiguous,(ReorderingBuffer *)local_140,
                   errorCode);
    limit_local = decomposeShort(this,limit_local,limit,'\x01',onlyContiguous,
                                 (ReorderingBuffer *)local_140,errorCode);
    UVar2 = ::U_FAILURE(*errorCode);
    if (UVar2 == '\0') {
      if ((long)limit_local - (long)_iStack_a0 < 0x80000000) {
        recompose(this,(ReorderingBuffer *)local_140,0,onlyContiguous);
        UVar2 = ReorderingBuffer::equals((ReorderingBuffer *)local_140,_iStack_a0,limit_local);
        puVar11 = prevSrc;
        if (UVar2 == '\0') {
          if (s16.fUnion._48_8_ == 0) {
            this_local._7_1_ = '\0';
            iStack_a8 = 1;
            goto LAB_001a327e;
          }
          if ((prevSrc != _iStack_a0) &&
             (UVar2 = ByteSinkUtil::appendUnchanged
                                (prevSrc,_iStack_a0,(ByteSink *)s16.fUnion._48_8_,options,edits,
                                 errorCode), UVar2 == '\0')) {
            iStack_a8 = 2;
            goto LAB_001a327e;
          }
          s16_00 = ReorderingBuffer::getStart((ReorderingBuffer *)local_140);
          iVar7 = ReorderingBuffer::length((ReorderingBuffer *)local_140);
          UVar2 = ByteSinkUtil::appendChange
                            (_iStack_a0,limit_local,s16_00,iVar7,(ByteSink *)s16.fUnion._48_8_,edits
                             ,errorCode);
          puVar11 = limit_local;
          if (UVar2 == '\0') {
            iStack_a8 = 2;
            goto LAB_001a327e;
          }
        }
        prevSrc = puVar11;
        iStack_a8 = 0;
      }
      else {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._7_1_ = '\x01';
        iStack_a8 = 1;
      }
    }
    else {
      iStack_a8 = 2;
    }
  }
  else {
    iStack_a8 = 2;
  }
LAB_001a327e:
  ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_140);
  if (iStack_a8 != 0) {
    if (iStack_a8 == 2) {
LAB_001a32ae:
      this_local._7_1_ = '\x01';
    }
LAB_001a32bc:
    UnicodeString::~UnicodeString((UnicodeString *)local_78);
    return this_local._7_1_;
  }
  goto LAB_001a1f54;
code_r0x001a2e2c:
  if (s16.fUnion._48_8_ == 0) {
    this_local._7_1_ = '\0';
    goto LAB_001a32bc;
  }
LAB_001a2e5c:
  UVar2 = norm16HasCompBoundaryBefore(this,norm16_01);
  if (UVar2 != '\0') {
    UVar2 = isCompYesAndZeroCC(this,norm16_01);
    if (UVar2 != '\0') {
      limit_local = ___lead_1;
    }
    goto LAB_001a1f54;
  }
  goto LAB_001a2ebe;
}

Assistant:

UBool
Normalizer2Impl::composeUTF8(uint32_t options, UBool onlyContiguous,
                             const uint8_t *src, const uint8_t *limit,
                             ByteSink *sink, Edits *edits, UErrorCode &errorCode) const {
    U_ASSERT(limit != nullptr);
    UnicodeString s16;
    uint8_t minNoMaybeLead = leadByteForCP(minCompNoMaybeCP);
    const uint8_t *prevBoundary = src;

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const uint8_t *prevSrc;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && sink != nullptr) {
                    ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                  *sink, options, edits, errorCode);
                }
                return TRUE;
            }
            if (*src < minNoMaybeLead) {
                ++src;
            } else {
                prevSrc = src;
                UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
                if (!isCompYesAndZeroCC(norm16)) {
                    break;
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (sink == nullptr) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    appendCodePointDelta(prevSrc, src, getAlgorithmicDelta(norm16), *sink, edits);
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    const uint16_t *mapping = getMapping(norm16);
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if (!ByteSinkUtil::appendChange(prevSrc, src, (const UChar *)mapping, length,
                                                    *sink, edits, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc &&
                            !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                           *sink, options, edits, errorCode)) {
                        break;
                    }
                    if (edits != nullptr) {
                        edits->addReplace((int32_t)(src - prevSrc), 0);
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16)) {
            // Jamo L: E1 84 80..92
            // Jamo V: E1 85 A1..B5
            // Jamo T: E1 86 A8..E1 87 82
            U_ASSERT((src - prevSrc) == 3 && *prevSrc == 0xe1);
            UChar32 prev = previousHangulOrJamo(prevBoundary, prevSrc);
            if (prevSrc[1] == 0x85) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar32 l = prev - Hangul::JAMO_L_BASE;
                if ((uint32_t)l < Hangul::JAMO_L_COUNT) {
                    if (sink == nullptr) {
                        return FALSE;
                    }
                    int32_t t = getJamoTMinusBase(src, limit);
                    if (t >= 0) {
                        // The next character is a Jamo T.
                        src += 3;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (prevSrc[2]-0xa1)) *
                            Hangul::JAMO_T_COUNT + t;
                        prevSrc -= 3;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc &&
                                !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                               *sink, options, edits, errorCode)) {
                            break;
                        }
                        ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (sink == nullptr) {
                    return FALSE;
                }
                UChar32 syllable = prev + getJamoTMinusBase(prevSrc, src);
                prevSrc -= 3;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc &&
                        !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                       *sink, options, edits, errorCode)) {
                    break;
                }
                ByteSinkUtil::appendCodePoint(prevSrc, src, syllable, *sink, edits);
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (sink == nullptr) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const uint8_t *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (sink != nullptr) {
                            ByteSinkUtil::appendUnchanged(prevBoundary, limit,
                                                          *sink, options, edits, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (sink == nullptr) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const uint8_t *p = prevSrc;
            UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, prevBoundary, p, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        ReorderingBuffer buffer(*this, s16, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, 0, onlyContiguous);
        if (!buffer.equals(prevSrc, src)) {
            if (sink == nullptr) {
                return FALSE;
            }
            if (prevBoundary != prevSrc &&
                    !ByteSinkUtil::appendUnchanged(prevBoundary, prevSrc,
                                                   *sink, options, edits, errorCode)) {
                break;
            }
            if (!ByteSinkUtil::appendChange(prevSrc, src, buffer.getStart(), buffer.length(),
                                            *sink, edits, errorCode)) {
                break;
            }
            prevBoundary = src;
        }
    }
    return TRUE;
}